

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

PixelBufferAccess * __thiscall
sglr::ReferenceContext::getFboAttachment
          (PixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,Framebuffer *framebuffer
          ,AttachmentPoint point)

{
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  AttachmentType AVar3;
  Type TVar4;
  int iVar5;
  uint uVar6;
  CubeFace CVar7;
  Texture *pTVar8;
  long lVar9;
  Renderbuffer *pRVar10;
  TestError *this_00;
  long lVar11;
  PixelBufferAccess level;
  
  AVar3 = framebuffer->m_attachments[point].type;
  if (AVar3 == ATTACHMENTTYPE_RENDERBUFFER) {
    pRVar10 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                        (&this->m_renderbuffers,framebuffer->m_attachments[point].name);
    if (pRVar10 != (Renderbuffer *)0x0) {
      tcu::TextureLevel::getAccess(__return_storage_ptr__,&pRVar10->m_data);
      return __return_storage_ptr__;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"rbo",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0x941);
LAB_006f2798:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (AVar3 == ATTACHMENTTYPE_TEXTURE) {
    pTVar8 = rc::ObjectManager<sglr::rc::Texture>::find
                       (&this->m_textures,framebuffer->m_attachments[point].name);
    if (pTVar8 == (Texture *)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"texture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0x923);
      goto LAB_006f2798;
    }
    TVar4 = pTVar8->m_type;
    if (TVar4 - TYPE_2D_ARRAY < 3) {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&level.super_ConstPixelBufferAccess);
      uVar6 = pTVar8->m_type - TYPE_2D_ARRAY;
      if (uVar6 < 3) {
        lVar9 = __dynamic_cast(pTVar8,&rc::Texture::typeinfo,(&PTR_typeinfo_00a30cb8)[uVar6],0);
        lVar11 = (long)framebuffer->m_attachments[point].level * 0x28;
        level.super_ConstPixelBufferAccess.m_data = *(void **)(lVar9 + 0x160 + lVar11);
        pTVar1 = (TextureFormat *)(lVar9 + 0x140 + lVar11);
        level.super_ConstPixelBufferAccess.m_format = *pTVar1;
        level.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar1[1];
        puVar2 = (undefined8 *)(lVar9 + 0x150 + lVar11);
        level.super_ConstPixelBufferAccess._16_8_ = *puVar2;
        level.super_ConstPixelBufferAccess.m_pitch.m_data._4_8_ = puVar2[1];
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (__return_storage_ptr__,(TextureFormat *)&level,
                 level.super_ConstPixelBufferAccess.m_size.m_data[0],
                 level.super_ConstPixelBufferAccess.m_size.m_data[1],1,
                 level.super_ConstPixelBufferAccess.m_pitch.m_data[1],0,
                 (void *)((long)(framebuffer->m_attachments[point].layer *
                                level.super_ConstPixelBufferAccess.m_pitch.m_data[2]) +
                         (long)level.super_ConstPixelBufferAccess.m_data));
      return __return_storage_ptr__;
    }
    if (TVar4 == TYPE_CUBE_MAP) {
      lVar9 = __dynamic_cast(pTVar8,&rc::Texture::typeinfo,&rc::TextureCube::typeinfo,0);
      iVar5 = framebuffer->m_attachments[point].level;
      CVar7 = texTargetToFace(framebuffer->m_attachments[point].texTarget);
      lVar9 = (long)iVar5 * 0x28 + (ulong)CVar7 * 0x540 + lVar9;
    }
    else {
      if (TVar4 != TYPE_2D) goto LAB_006f269d;
      lVar9 = __dynamic_cast(pTVar8,&rc::Texture::typeinfo,&rc::Texture2D::typeinfo,0);
      lVar9 = lVar9 + (long)framebuffer->m_attachments[point].level * 0x28;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&__return_storage_ptr__->super_ConstPixelBufferAccess,
               (ConstPixelBufferAccess *)(lVar9 + 0x140));
  }
  else {
LAB_006f269d:
    nullAccess();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess ReferenceContext::getFboAttachment (const rc::Framebuffer& framebuffer, rc::Framebuffer::AttachmentPoint point)
{
	const Framebuffer::Attachment& attachment = framebuffer.getAttachment(point);

	switch (attachment.type)
	{
		case Framebuffer::ATTACHMENTTYPE_TEXTURE:
		{
			Texture* texture = m_textures.find(attachment.name);
			TCU_CHECK(texture);

			if (texture->getType() == Texture::TYPE_2D)
				return dynamic_cast<Texture2D*>(texture)->getLevel(attachment.level);
			else if (texture->getType() == Texture::TYPE_CUBE_MAP)
				return dynamic_cast<TextureCube*>(texture)->getFace(attachment.level, texTargetToFace(attachment.texTarget));
			else if (texture->getType() == Texture::TYPE_2D_ARRAY	||
					 texture->getType() == Texture::TYPE_3D			||
					 texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				tcu::PixelBufferAccess level;

				if (texture->getType() == Texture::TYPE_2D_ARRAY)
					level = dynamic_cast<Texture2DArray*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_3D)
					level = dynamic_cast<Texture3D*>(texture)->getLevel(attachment.level);
				else if (texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
					level = dynamic_cast<TextureCubeArray*>(texture)->getLevel(attachment.level);

				void* layerData = static_cast<deUint8*>(level.getDataPtr()) + level.getSlicePitch() * attachment.layer;

				return tcu::PixelBufferAccess(level.getFormat(), level.getWidth(), level.getHeight(), 1, level.getRowPitch(), 0, layerData);
			}
			else
				return nullAccess();
		}

		case Framebuffer::ATTACHMENTTYPE_RENDERBUFFER:
		{
			Renderbuffer* rbo = m_renderbuffers.find(attachment.name);
			TCU_CHECK(rbo);

			return rbo->getAccess();
		}

		default:
			return nullAccess();
	}
}